

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O2

OP1aHeader * __thiscall
ASDCP::MXF::OP1aHeader::InitFromPartitionBuffer(OP1aHeader *this,byte_t *p,ui32_t l)

{
  uint uVar1;
  int in_ECX;
  undefined4 in_register_00000014;
  
  KLVPacket::InitFromBuffer((KLVPacket *)this,p,l);
  if (-1 < *(int *)&(this->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket) {
    Partition::InitFromBuffer
              ((Partition *)&stack0xffffffffffffff78,p,(ui32_t)*(undefined8 *)(p + 0x18));
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff78);
    Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff78);
    if (-1 < *(int *)&(this->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket) {
      uVar1 = *(int *)(p + 0x10) + (int)*(undefined8 *)(p + 0x20);
      (**(code **)(*(long *)p + 0x28))
                (&stack0xffffffffffffff78,p,CONCAT44(in_register_00000014,l) + (ulong)uVar1,
                 in_ECX - uVar1);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff78);
      Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff78);
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::OP1aHeader::InitFromPartitionBuffer(const byte_t* p, ui32_t l)
{
  Result_t result = KLVPacket::InitFromBuffer(p, l);

  if ( ASDCP_SUCCESS(result) )
    result = Partition::InitFromBuffer(m_ValueStart, m_ValueLength); // test UL and OP

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t pp_len = KLVPacket::PacketLength();
      result = InitFromBuffer(p + pp_len, l - pp_len);
    }

  return result;
}